

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O3

Result * CoreML::validateKernel(Result *__return_storage_ptr__,Kernel *kernel)

{
  double *pdVar1;
  RBFKernel *pRVar2;
  string local_30;
  
  switch(kernel->_oneof_case_[0]) {
  case 1:
    goto switchD_00299407_caseD_1;
  case 2:
    pRVar2 = (kernel->kernel_).rbfkernel_;
    break;
  case 3:
    pdVar1 = &((kernel->kernel_).polykernel_)->gamma_;
    if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"Gamma must be greater than or equal to zero","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00299568;
    }
    if (((kernel->kernel_).polykernel_)->degree_ < 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"Degree must be greater than or equal to zero","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00299568;
    }
    pRVar2 = Specification::RBFKernel::default_instance();
    break;
  case 4:
    pdVar1 = &((kernel->kernel_).rbfkernel_)->gamma_;
    if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"Gamma must be greater than or equal to zero","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00299568;
    }
    goto switchD_00299407_caseD_1;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"You must specify a supported kernel type","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
    goto LAB_00299568;
  }
  if (pRVar2->gamma_ <= 0.0 && pRVar2->gamma_ != 0.0) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"Gamma must be greater than or equal to zero","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
LAB_00299568:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
switchD_00299407_caseD_1:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateKernel(const Specification::Kernel& kernel) {
        switch (kernel.kernel_case()) {
            case Specification::Kernel::kPolyKernel:
                if(kernel.polykernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                if(kernel.polykernel().degree() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Degree must be greater than or equal to zero");
            case Specification::Kernel::kRbfKernel:
                if(kernel.rbfkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                break;
            case Specification::Kernel::kSigmoidKernel:
                if(kernel.sigmoidkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
            case Specification::Kernel::kLinearKernel:
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "You must specify a supported kernel type");
        }
        return Result();
    }